

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall
CompressedArray::const_iterator::switch_to_record(const_iterator *this,uint32_t record_index)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  difference_type dVar4;
  uint in_ESI;
  __normal_iterator<const_CompressedArray::BlockHeader_*,_std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>_>
  *in_RDI;
  bool bVar5;
  uint32_t block_index;
  __normal_iterator<const_CompressedArray::BlockHeader_*,_std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>_>
  it;
  BlockHeader header;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  uint32_t in_stack_ffffffffffffff8c;
  const_iterator *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<const_CompressedArray::BlockHeader_*,_std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>_>
  local_28;
  undefined1 local_1c [8];
  uint local_14;
  uint local_c;
  
  local_c = in_ESI;
  if (in_RDI->_M_current[0xc].key.word_index < in_ESI) {
    local_c = in_RDI->_M_current[0xc].key.word_index;
  }
  BlockHeader::BlockHeader((BlockHeader *)0x16273b);
  local_14 = local_c;
  cVar2 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
          begin((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  cVar3 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
          end((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> *
              )CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  local_28 = std::
             upper_bound<__gnu_cxx::__normal_iterator<CompressedArray::BlockHeader_const*,std::vector<CompressedArray::BlockHeader,std::allocator<CompressedArray::BlockHeader>>>,CompressedArray::BlockHeader,CompressedArray::const_iterator::switch_to_record(unsigned_int)::__0>
                       (cVar2._M_current,cVar3._M_current,local_1c);
  __gnu_cxx::
  __normal_iterator<const_CompressedArray::BlockHeader_*,_std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>_>
  ::operator--(&local_28);
  cVar2 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
          begin((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  dVar4 = __gnu_cxx::operator-
                    (in_RDI,(__normal_iterator<const_CompressedArray::BlockHeader_*,_std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  iVar1 = (int)dVar4;
  switch_to_block(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  while( true ) {
    bVar5 = false;
    if (*(int *)&in_RDI[1]._M_current == iVar1) {
      bVar5 = *(uint *)((long)&in_RDI[1]._M_current + 4) < local_c;
    }
    if (!bVar5) break;
    operator++((const_iterator *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),
               (int)((ulong)cVar2._M_current >> 0x20));
  }
  return;
}

Assistant:

void CompressedArray::const_iterator::switch_to_record(uint32_t record_index) {
    if (record_index > array->record_count)
        record_index = array->record_count;

    BlockHeader header;
    header.record_index = record_index;
    auto it = upper_bound(array->headers.begin(), array->headers.end(), header,
                          [](const BlockHeader& first, const BlockHeader& second) {
                              return first.record_index < second.record_index;
                          });
    --it;

    uint32_t block_index = uint32_t(it - array->headers.begin());
    switch_to_block(block_index);
    while (this->block_index == block_index && this->record_index < record_index)
        (*this)++;
}